

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void __thiscall callback_data::reset(callback_data *this)

{
  pointer ppgVar1;
  pointer ppgVar2;
  
  ppgVar1 = (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppgVar2 = (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppgVar2 != ppgVar1; ppgVar2 = ppgVar2 + 1
      ) {
    free((*ppgVar2)->data);
  }
  ppgVar1 = (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppgVar2 = (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppgVar2 != ppgVar1; ppgVar2 = ppgVar2 + 1
      ) {
    free((*ppgVar2)->data);
  }
  ppgVar1 = (this->v_diff_filtered).
            super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppgVar2 = (this->v_diff_filtered).
                 super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppgVar2 != ppgVar1; ppgVar2 = ppgVar2 + 1) {
    free((*ppgVar2)->data);
  }
  ppgVar2 = (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppgVar2) {
    (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppgVar2;
  }
  ppgVar2 = (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppgVar2) {
    (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppgVar2;
  }
  ppgVar2 = (this->v_diff_filtered).
            super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->v_diff_filtered).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppgVar2) {
    (this->v_diff_filtered).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppgVar2;
  }
  if (this->ctx_ggml != (ggml_context *)0x0) {
    ggml_free();
  }
  this->ctx_ggml = (ggml_context *)0x0;
  return;
}

Assistant:

void reset() {
        for (auto ptr : v_pos) free(ptr->data);
        for (auto ptr : v_neg) free(ptr->data);
        for (auto ptr : v_diff_filtered) free(ptr->data);
        v_pos.clear();
        v_neg.clear();
        v_diff_filtered.clear();
        if (ctx_ggml) {
            ggml_free(ctx_ggml);
        }
        ctx_ggml = nullptr;
    }